

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodeVP8LData(WebPIDecoder *idec)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  size_t curr_size;
  VP8LDecoder *dec;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  WebPIDecoder *idec_00;
  DecState local_4;
  
  idec_00 = *(WebPIDecoder **)(in_RDI + 0x80);
  sVar2 = MemDataSize((MemBuffer_conflict *)(in_RDI + 0x128));
  *(uint *)&(idec_00->params_).scaler_a = (uint)(sVar2 < *(ulong *)(in_RDI + 0x1e0));
  iVar1 = VP8LDecodeImage((VP8LDecoder *)idec_00);
  if (iVar1 == 0) {
    local_4 = ErrorStatusLossless((WebPIDecoder *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  VP8_STATUS_OK);
  }
  else if (idec_00->state_ == STATE_VP8L_DATA) {
    local_4 = idec_00->state_;
  }
  else {
    local_4 = FinishDecoding(idec_00);
  }
  return local_4;
}

Assistant:

static VP8StatusCode DecodeVP8LData(WebPIDecoder* const idec) {
  VP8LDecoder* const dec = (VP8LDecoder*)idec->dec_;
  const size_t curr_size = MemDataSize(&idec->mem_);
  assert(idec->is_lossless_);

  // Switch to incremental decoding if we don't have all the bytes available.
  dec->incremental_ = (curr_size < idec->chunk_size_);

  if (!VP8LDecodeImage(dec)) {
    return ErrorStatusLossless(idec, dec->status_);
  }
  assert(dec->status_ == VP8_STATUS_OK || dec->status_ == VP8_STATUS_SUSPENDED);
  return (dec->status_ == VP8_STATUS_SUSPENDED) ? dec->status_
                                                : FinishDecoding(idec);
}